

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O1

event_process_result __thiscall
afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
process_event<vending::events::load_done>
          (state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,load_done *event)

{
  __atomic_flag_data_type _Var1;
  event_process_result eVar2;
  id_type *local_28;
  anon_class_16_2_20c42392_conflict local_20;
  
  if ((this->queue_size_).super___atomic_base<unsigned_long>._M_i == 0) {
    LOCK();
    _Var1 = (this->is_top_).super___atomic_flag_base._M_i;
    (this->is_top_).super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) {
      eVar2 = process_event_impl<vending::events::load_done>
                        (this,event,
                         (process_type<actions::event_process_result::process> *)&local_20);
      LOCK();
      (this->is_top_).super___atomic_flag_base._M_i = false;
      UNLOCK();
      goto LAB_003a1ef6;
    }
  }
  LOCK();
  (this->queue_size_).super___atomic_base<unsigned_long>._M_i =
       (this->queue_size_).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  local_28 = (id_type *)&detail::event<vending::events::load_done>::id;
  local_20.this = this;
  std::
  deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
  ::
  emplace_back<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>::enqueue_event<vending::events::load_done>(vending::events::load_done&&)::_lambda()_1_,afsm::detail::event_base::id_type_const*>
            ((deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
              *)&this->queued_events_,&local_20,&local_28);
  eVar2 = defer;
LAB_003a1ef6:
  process_event_queue(this);
  return eVar2;
}

Assistant:

actions::event_process_result
    process_event( Event&& event )
    {
        if (!queue_size_ && !is_top_.test_and_set()) {
            auto res = process_event_dispatch(::std::forward<Event>(event));
            is_top_.clear();
            // Process enqueued events
            process_event_queue();
            return res;
        } else {
            // Enqueue event
            enqueue_event(::std::forward<Event>(event));
            return actions::event_process_result::defer;
        }
    }